

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O3

ref<immutable::rrb_details::tree_node<char,_false>_> __thiscall
immutable::rrb_details::rrb_drop_left_rec<char,false,6>
          (rrb_details *this,uint32_t *total_shift,
          ref<immutable::rrb_details::tree_node<char,_false>_> *root,uint32_t left,uint32_t shift,
          bool has_right)

{
  ref<immutable::rrb_details::rrb_size_table<false>_> *__dest;
  int *piVar1;
  int iVar2;
  rrb_size_table<false> *prVar3;
  undefined1 auVar4 [16];
  ref<immutable::rrb_details::internal_node<char,_false>_> rVar5;
  undefined4 *__ptr;
  internal_node<char,_false> *piVar6;
  ulong uVar7;
  uint32_t uVar8;
  char *__function;
  uint uVar9;
  tree_node<char,_false> *ptVar10;
  undefined4 in_register_00000084;
  internal_node<char,_false> *p_node;
  uint32_t *puVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ref<immutable::rrb_details::internal_node<char,_false>_> internal_left_hand_node;
  ref<immutable::rrb_details::tree_node<char,_false>_> left_hand_node;
  ref<immutable::rrb_details::tree_node<char,_false>_> child;
  ref<immutable::rrb_details::rrb_size_table<false>_> sliced_table;
  ref<immutable::rrb_details::internal_node<char,_false>_> local_90;
  size_t local_88;
  undefined8 local_80;
  internal_node<char,_false> *local_78;
  rrb_size_table<false> *local_70;
  tree_node<char,_false> *local_68;
  uint32_t *local_60;
  ref<immutable::rrb_details::tree_node<char,_false>_> local_58;
  uint32_t local_4c;
  ref<immutable::rrb_details::tree_node<char,_false>_> local_48;
  ref<immutable::rrb_details::rrb_size_table<false>_> *local_40;
  ref<immutable::rrb_details::rrb_size_table<false>_> local_38;
  
  local_80 = CONCAT44(in_register_00000084,shift);
  uVar14 = left >> ((byte)shift & 0x1f);
  p_node = (internal_node<char,_false> *)root->ptr;
  if (shift == 0) {
    if (p_node != (internal_node<char,_false> *)0x0) {
      p_node->_ref_count = p_node->_ref_count + 1;
      uVar8 = p_node->len;
      uVar12 = (ulong)(uVar8 - uVar14);
      __ptr = (undefined4 *)malloc(uVar12 + 0x18);
      __ptr[1] = uVar8 - uVar14;
      *__ptr = 0;
      *(undefined4 **)(__ptr + 4) = __ptr + 6;
      __ptr[3] = 0;
      if (uVar8 - uVar14 == 0) {
        __ptr[2] = 1;
      }
      else {
        uVar7 = 0;
        do {
          *(undefined1 *)(*(long *)(__ptr + 4) + uVar7) = 0;
          uVar7 = uVar7 + 1;
        } while (uVar12 != uVar7);
        __ptr[2] = 1;
        if (uVar8 != uVar14) {
          uVar7 = 0;
          do {
            *(undefined1 *)(*(long *)(__ptr + 4) + uVar7) =
                 *(undefined1 *)
                  ((long)&((p_node->size_table).ptr)->size + (ulong)(uVar14 + (int)uVar7));
            uVar7 = uVar7 + 1;
          } while (uVar12 != uVar7);
          iVar2 = __ptr[2];
          *total_shift = 0;
          *(undefined4 **)this = __ptr;
          if (iVar2 == 0) {
            free(__ptr);
          }
          goto LAB_001508f0;
        }
      }
      *total_shift = 0;
      *(undefined4 **)this = __ptr;
LAB_001508f0:
      uVar8 = p_node->_ref_count;
      p_node->_ref_count = uVar8 - 1;
      if (uVar8 == 1) {
        free(p_node);
      }
      return (ref<immutable::rrb_details::tree_node<char,_false>_>)(tree_node<char,_false> *)this;
    }
    __function = 
    "T *immutable::ref<immutable::rrb_details::leaf_node<char, false>>::operator->() const [T = immutable::rrb_details::leaf_node<char, false>]"
    ;
    goto LAB_00150dbc;
  }
  if (p_node != (internal_node<char,_false> *)0x0) {
    p_node->_ref_count = p_node->_ref_count + 1;
    prVar3 = (p_node->size_table).ptr;
    if (prVar3 == (rrb_size_table<false> *)0x0) {
      uVar8 = left - (uVar14 << ((byte)shift & 0x1f));
    }
    else {
      puVar11 = prVar3->size;
      uVar12 = (ulong)(uVar14 - 1);
      do {
        uVar7 = uVar12;
        uVar14 = (int)uVar7 + 1;
        uVar12 = (ulong)uVar14;
      } while (puVar11[uVar14] <= left);
      if (uVar14 == 0) {
        uVar14 = 0;
        uVar8 = left;
      }
      else {
        uVar8 = left - puVar11[uVar7];
      }
    }
    uVar9 = p_node->len - 1;
    local_48.ptr = (tree_node<char,_false> *)p_node->child[uVar14].ptr;
    if ((internal_node<char,_false> *)local_48.ptr != (internal_node<char,_false> *)0x0) {
      ((internal_node<char,_false> *)local_48.ptr)->_ref_count =
           ((internal_node<char,_false> *)local_48.ptr)->_ref_count + 1;
    }
    local_68 = (tree_node<char,_false> *)this;
    local_60 = total_shift;
    rrb_drop_left_rec<char,false,6>
              ((rrb_details *)&local_58,total_shift,&local_48,uVar8,shift - 6,
               uVar14 != uVar9 || has_right);
    if (uVar14 != uVar9) {
      local_4c = p_node->len;
      uVar9 = local_4c - uVar14;
      uVar12 = (ulong)uVar9;
      local_88 = uVar12 * 8;
      local_78 = p_node;
      piVar6 = (internal_node<char,_false> *)malloc(uVar12 * 8 + 0x20);
      piVar6->len = uVar9;
      piVar6->type = INTERNAL_NODE;
      local_40 = &piVar6->size_table;
      (piVar6->size_table).ptr = (rrb_size_table<false> *)0x0;
      piVar6->guid = 0;
      piVar6->child = (ref<immutable::rrb_details::internal_node<char,_false>_> *)(piVar6 + 1);
      memset(piVar6 + 1,0,local_88);
      piVar6->_ref_count = 1;
      local_88 = (ulong)uVar14;
      for (lVar13 = 0; p_node = local_78, uVar14 = uVar14 + 1, (ulong)(uVar9 - 1) << 3 != lVar13;
          lVar13 = lVar13 + 8) {
        ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                  ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                   ((long)&piVar6->child[1].ptr + lVar13),local_78->child + uVar14);
      }
      local_70 = (local_78->size_table).ptr;
      if (local_70 != (rrb_size_table<false> *)0x0) {
        local_70->_ref_count = local_70->_ref_count + 1;
      }
      local_90.ptr = (internal_node<char,_false> *)malloc(uVar12 * 4 + 0x10);
      ptVar10 = local_68;
      __dest = &(local_90.ptr)->size_table;
      *(ref<immutable::rrb_details::rrb_size_table<false>_> **)local_90.ptr = __dest;
      (local_90.ptr)->guid = 0;
      (local_90.ptr)->_ref_count = 1;
      auVar4 = _DAT_00153110;
      if (local_70 == (rrb_size_table<false> *)0x0) {
        if (local_4c != (uint32_t)local_88) {
          lVar13 = uVar12 - 1;
          auVar15._8_4_ = (int)lVar13;
          auVar15._0_8_ = lVar13;
          auVar15._12_4_ = (int)((ulong)lVar13 >> 0x20);
          uVar7 = 0;
          auVar15 = auVar15 ^ _DAT_00153110;
          auVar16 = _DAT_00153100;
          do {
            auVar17 = auVar16 ^ auVar4;
            if ((bool)(~(auVar17._4_4_ == auVar15._4_4_ && auVar15._0_4_ < auVar17._0_4_ ||
                        auVar15._4_4_ < auVar17._4_4_) & 1)) {
              *(uint32_t *)((long)&((local_90.ptr)->size_table).ptr + uVar7 * 4) =
                   (uint32_t)local_88 + 1 + (int)uVar7 << ((byte)local_80 & 0x1f);
            }
            if ((auVar17._12_4_ != auVar15._12_4_ || auVar17._8_4_ <= auVar15._8_4_) &&
                auVar17._12_4_ <= auVar15._12_4_) {
              *(uint32_t *)((long)&((local_90.ptr)->size_table).ptr + uVar7 * 4 + 4) =
                   (uint32_t)local_88 + 2 + (int)uVar7 << ((byte)local_80 & 0x1f);
            }
            uVar7 = uVar7 + 2;
            lVar13 = auVar16._8_8_;
            auVar16._0_8_ = auVar16._0_8_ + 2;
            auVar16._8_8_ = lVar13 + 2;
          } while ((uVar12 + 1 & 0xfffffffffffffffe) != uVar7);
        }
      }
      else {
        memcpy(__dest,local_70->size + local_88,uVar12 * 4);
      }
      if (local_4c != (uint32_t)local_88) {
        uVar7 = 0;
        do {
          piVar1 = (int *)((long)&__dest->ptr + uVar7 * 4);
          *piVar1 = *piVar1 - left;
          uVar7 = uVar7 + 1;
        } while (uVar12 != uVar7);
      }
      ref<immutable::rrb_details::rrb_size_table<false>_>::operator=
                (local_40,(ref<immutable::rrb_details::rrb_size_table<false>_> *)&local_90);
      ref<immutable::rrb_details::internal_node<char,false>>::operator=
                ((ref<immutable::rrb_details::internal_node<char,false>> *)piVar6->child,&local_58);
      *local_60 = (uint32_t)local_80;
      piVar6->_ref_count = piVar6->_ref_count + 1;
      *(internal_node<char,_false> **)ptVar10 = piVar6;
      if ((local_90.ptr != (internal_node<char,_false> *)0x0) &&
         (uVar8 = (local_90.ptr)->_ref_count, (local_90.ptr)->_ref_count = uVar8 - 1, uVar8 == 1)) {
        free(local_90.ptr);
      }
      if ((local_70 != (rrb_size_table<false> *)0x0) &&
         (uVar8 = local_70->_ref_count, local_70->_ref_count = uVar8 - 1, uVar8 == 1)) {
        free(local_70);
      }
      release<char>(piVar6);
      goto LAB_00150d62;
    }
    if (!has_right) {
      *(tree_node<char,_false> **)local_68 = local_58.ptr;
      ptVar10 = local_68;
      if ((internal_node<char,_false> *)local_58.ptr != (internal_node<char,_false> *)0x0) {
        (local_58.ptr)->_ref_count = (local_58.ptr)->_ref_count + 1;
      }
      goto LAB_00150d62;
    }
    piVar6 = (internal_node<char,_false> *)malloc(0x28);
    ptVar10 = local_68;
    piVar6->type = INTERNAL_NODE;
    piVar6->len = 1;
    (piVar6->size_table).ptr = (rrb_size_table<false> *)0x0;
    piVar6->child = (ref<immutable::rrb_details::internal_node<char,_false>_> *)(piVar6 + 1);
    piVar6[1].type = LEAF_NODE;
    piVar6[1].len = 0;
    piVar6->_ref_count = 1;
    piVar6->guid = 0;
    local_90.ptr = (internal_node<char,_false> *)local_58.ptr;
    if ((internal_node<char,_false> *)local_58.ptr != (internal_node<char,_false> *)0x0) {
      (local_58.ptr)->_ref_count = (local_58.ptr)->_ref_count + 1;
    }
    ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
              ((ref<immutable::rrb_details::internal_node<char,_false>_> *)(piVar6 + 1),&local_90);
    rVar5.ptr = local_90.ptr;
    puVar11 = local_60;
    if (shift - 6 != 0) {
      if (local_90.ptr == (internal_node<char,_false> *)0x0) goto LAB_00150d90;
      prVar3 = ((local_90.ptr)->size_table).ptr;
      ptVar10 = local_68;
      if (prVar3 != (rrb_size_table<false> *)0x0) {
        local_38.ptr = (rrb_size_table<false> *)malloc(0x14);
        (local_38.ptr)->size = (uint32_t *)(local_38.ptr + 1);
        (local_38.ptr)->guid = 0;
        (local_38.ptr)->_ref_count = 1;
        *(uint32_t *)&local_38.ptr[1].size = prVar3->size[(rVar5.ptr)->len - 1];
        ref<immutable::rrb_details::rrb_size_table<false>_>::operator=
                  (&piVar6->size_table,&local_38);
        puVar11 = local_60;
        ptVar10 = local_68;
        if ((local_38.ptr != (rrb_size_table<false> *)0x0) &&
           (uVar8 = (local_38.ptr)->_ref_count, (local_38.ptr)->_ref_count = uVar8 - 1, uVar8 == 1))
        {
          free(local_38.ptr);
        }
      }
    }
    *puVar11 = (uint32_t)local_80;
    *(internal_node<char,_false> **)ptVar10 = piVar6;
    piVar6->_ref_count = piVar6->_ref_count + 1;
    release<char>(local_90.ptr);
    release<char>(piVar6);
LAB_00150d62:
    ref<immutable::rrb_details::tree_node<char,_false>_>::~ref(&local_58);
    ref<immutable::rrb_details::tree_node<char,_false>_>::~ref(&local_48);
    release<char>(p_node);
    return (ref<immutable::rrb_details::tree_node<char,_false>_>)ptVar10;
  }
LAB_00150d90:
  __function = 
  "T *immutable::ref<immutable::rrb_details::internal_node<char, false>>::operator->() const [T = immutable::rrb_details::internal_node<char, false>]"
  ;
LAB_00150dbc:
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,__function);
}

Assistant:

inline ref<tree_node<T, atomic_ref_counting>> rrb_drop_left_rec(uint32_t *total_shift, const ref<tree_node<T, atomic_ref_counting>>& root, uint32_t left, uint32_t shift, bool has_right)
      {
      const uint32_t subshift = shift - bits<N>::rrb_bits;
      uint32_t subidx = left >> shift;
      if (shift > 0)
        {
        ref<internal_node<T, atomic_ref_counting>> internal_root = root;
        uint32_t idx = left;
        if (internal_root->size_table.ptr == nullptr)
          {
          idx -= subidx << shift;
          }
        else
          { // if (internal_root->size_table != NULL)
          const rrb_size_table<atomic_ref_counting> *table = internal_root->size_table.ptr;

          while (table->size[subidx] <= idx)
            {
            subidx++;
            }
          if (subidx != 0)
            {
            idx -= table->size[subidx - 1];
            }
          }

        const uint32_t last_slot = internal_root->len - 1;
        ref<tree_node<T, atomic_ref_counting>> child = internal_root->child[subidx];
        ref<tree_node<T, atomic_ref_counting>> left_hand_node = rrb_drop_left_rec<T, atomic_ref_counting, N>(total_shift, child, idx, subshift, (subidx != last_slot) | has_right);
        if (subidx == last_slot)
          { // No more slots left
          if (has_right)
            {
            ref<internal_node<T, atomic_ref_counting>> left_hand_parent = internal_node_create<T, atomic_ref_counting>(1);
            ref<internal_node<T, atomic_ref_counting>> internal_left_hand_node = left_hand_node;
            left_hand_parent->child[0] = internal_left_hand_node;

            if (subshift != 0 && internal_left_hand_node->size_table.ptr != nullptr)
              {
              ref<rrb_size_table<atomic_ref_counting>> sliced_table = size_table_create<atomic_ref_counting>(1);
              sliced_table->size[0] = internal_left_hand_node->size_table->size[internal_left_hand_node->len - 1];
              left_hand_parent->size_table = sliced_table;
              }
            *total_shift = shift;
            return left_hand_parent;
            }
          else
            { // if (!has_right)
            return left_hand_node;
            }
          }
        else
          { // if (subidx != last_slot)

          const uint32_t sliced_len = internal_root->len - subidx;
          ref<internal_node<T, atomic_ref_counting>> sliced_root = internal_node_create<T, atomic_ref_counting>(sliced_len);

          // TODO: Can shrink size here if sliced_len == 2, using the ambidextrous
          // vector technique w. offset. Takes constant time.

          for (uint32_t i = 0; i < (sliced_len - 1); ++i)
            sliced_root->child[1 + i] = internal_root->child[subidx + 1 + i];

          ref<rrb_size_table<atomic_ref_counting>> table = internal_root->size_table; // [JanM] copy seems unnecessary, todo

          // TODO: Can check if left is a power of the tree size. If so, all nodes
          // will be completely populated, and we can ignore the size table. Most
          // importantly, this will remove the need to alloc a size table, which
          // increases perf.
          ref<rrb_size_table<atomic_ref_counting>> sliced_table = size_table_create<atomic_ref_counting>(sliced_len);

          if (table.ptr == nullptr)
            {
            for (uint32_t i = 0; i < sliced_len; i++)
              {
              // left is total amount sliced off. By adding in subidx, we get faster
              // computation later on.
              sliced_table->size[i] = (subidx + 1 + i) << shift;
              // NOTE: This doesn't really work properly for top root, as last node
              // may have a higher count than it *actually* has. To remedy for this,
              // the top function performs a check afterwards, which may insert the
              // correct value if there's a size table in the root.
              }
            }
          else
            { // if (table != NULL)
            memcpy(sliced_table->size, &table->size[subidx], sliced_len * sizeof(uint32_t));
            }

          for (uint32_t i = 0; i < sliced_len; i++)
            {
            sliced_table->size[i] -= left;
            }

          sliced_root->size_table = sliced_table;
          sliced_root->child[0] = left_hand_node;
          *total_shift = shift;
          return sliced_root;
          }
        }
      else
        { // if (shift <= RRB_BRANCHING)
        ref<leaf_node<T, atomic_ref_counting>> leaf_root = root;
        const uint32_t right_vals_len = leaf_root->len - subidx;
        ref<leaf_node<T, atomic_ref_counting>> right_vals = leaf_node_create<T, atomic_ref_counting>(right_vals_len);

        //memcpy(right_vals->child, &leaf_root->child[subidx], right_vals_len * sizeof(T));
        for (uint32_t i = 0; i < right_vals_len; ++i)
          right_vals->child[i] = leaf_root->child[subidx + i]; // don't memcpy, but use copy constructor

        *total_shift = shift;

        return right_vals;
        }
      }